

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O2

char * zt_cstr_path_append(char *path1,char *path2)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  sVar1 = strlen(path1);
  sVar2 = strlen(path2);
  uVar6 = sVar1 - 1;
  uVar7 = uVar6;
  do {
    uVar5 = (long)uVar6 >> 0x3f & uVar6;
    if ((long)uVar7 < 1) break;
    pcVar4 = path1 + uVar7;
    uVar5 = uVar7;
    uVar7 = uVar7 - 1;
  } while (*pcVar4 == '/');
  sVar1 = 0;
  if ((long)sVar2 < 1) {
    sVar2 = sVar1;
  }
  for (; (sVar3 = sVar2, sVar2 != sVar1 && (sVar3 = sVar1, path2[sVar1] == '/')); sVar1 = sVar1 + 1)
  {
  }
  pcVar4 = zt_cstr_catv(path1,0,uVar5,"/",0,0xffffffffffffffff,path2,sVar3,0xffffffff,0);
  return pcVar4;
}

Assistant:

char *
zt_cstr_path_append(const char *path1, const char *path2) {
    char    * rpath = NULL;
    size_t    len1;
    size_t    len2;
    size_t    sep_len;
    ssize_t   x;
    ssize_t   y;

    len1    = strlen(path1);
    len2    = strlen(path2);
    sep_len = strlen(PATH_SEPERATOR);

    for (y = len1 - 1; y > 0 && strncmp(&path1[y], PATH_SEPERATOR, sep_len) == 0; y--) {
        ;
    }
    for (x = 0; x < (ssize_t)len2 && strncmp(&path2[x], PATH_SEPERATOR, sep_len) == 0; x++) {
        ;
    }

    rpath = zt_cstr_catv(path1, 0, y,
                         PATH_SEPERATOR, 0, -1,
                         path2, x, -1, NULL);
    return rpath;
}